

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O3

bool mxx::
     is_sorted<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxDistribution_StableBlockDistr_Test::TestBody()::__0>
               (int *begin,int *end,long param_3)

{
  int *piVar1;
  int *piVar2;
  pair<int,_int> pVar3;
  int *piVar4;
  bool bVar5;
  int result;
  int i;
  int local_54;
  comm local_50;
  
  piVar4 = begin;
  if (begin != end) {
    piVar1 = begin + 2;
    do {
      piVar2 = piVar1;
      piVar4 = end;
      if (piVar2 == end) break;
      piVar1 = piVar2 + 2;
      piVar4 = piVar2;
    } while (piVar2[-2] <= *piVar2);
  }
  bVar5 = piVar4 == end;
  if (*(int *)(param_3 + 0x10) != 1) {
    local_50._vptr_comm = (_func_int **)&PTR__comm_001a58a0;
    local_50.mpi_comm = (MPI_Comm)&ompi_mpi_comm_world;
    MPI_Comm_size(&ompi_mpi_comm_world,&local_50.m_size);
    MPI_Comm_rank(local_50.mpi_comm,&local_50.m_rank);
    local_50.do_free = false;
    pVar3 = right_shift<std::pair<int,int>>((pair<int,_int> *)(end + -2),&local_50);
    comm::~comm(&local_50);
    bVar5 = *(int *)(param_3 + 0x14) < 1 && piVar4 == end;
    if ((0 < *(int *)(param_3 + 0x14)) && (piVar4 == end)) {
      bVar5 = pVar3.first <= *begin;
    }
    local_50._vptr_comm = (_func_int **)CONCAT44(local_50._vptr_comm._4_4_,(uint)bVar5);
    MPI_Allreduce(&local_50,&local_54,1,&ompi_mpi_int,&ompi_mpi_op_land,*(undefined8 *)(param_3 + 8)
                 );
    bVar5 = local_54 != 0;
  }
  return bVar5;
}

Assistant:

bool is_sorted(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm = mxx::comm()) {
    return impl::is_sorted(begin, end, comp, comm);
}